

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall TaprootScriptTree_Branch_Test::TestBody(TaprootScriptTree_Branch_Test *this)

{
  allocator<cfd::core::ByteData256> *this_00;
  initializer_list<cfd::core::ByteData256> __l;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char *pcVar3;
  ScriptBuilder *this_01;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *in_R9;
  ByteData256 *local_ae0;
  AssertionResult gtest_ar_14;
  CfdException *except_1;
  Message local_a60;
  string local_a58;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_a08 [8];
  TaprootScriptTree rebuild_tree;
  AssertionResult gtest_ar_12;
  CfdException *except;
  Message local_948;
  string local_940;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_11;
  TapBranch br;
  Message local_890;
  undefined1 local_888 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_870 [8];
  string exp_tree_str;
  string tree_str;
  AssertHelper local_810;
  Message local_808;
  bool local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__1;
  SchnorrSignature sig;
  Privkey sk;
  SchnorrPubkey pk;
  string local_780;
  undefined1 local_760 [8];
  ByteData256 msg;
  Message local_740;
  Privkey local_738;
  string local_718;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_9;
  TaprootScriptTree tree2;
  Message local_650;
  Privkey local_648;
  string local_628;
  undefined1 local_608 [8];
  AssertionResult gtest_ar_8;
  Message local_5f0;
  SchnorrPubkey local_5e8;
  string local_5d0;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_7;
  Message local_598;
  ByteData256 local_590;
  string local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_6;
  Message local_540;
  ByteData256 local_538;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_5;
  Message local_4e8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_4e0;
  string local_4c8;
  string local_4a8;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_4;
  size_t index;
  AssertHelper local_458;
  Message local_450;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_448;
  size_type local_430;
  size_type local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_3;
  Message local_408;
  Script local_400;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_2;
  Message local_370;
  uint8_t local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_1;
  TapBranch local_338;
  undefined1 local_2c0 [8];
  TaprootScriptTree tree;
  string local_228;
  allocator local_201;
  string local_200;
  ByteData256 *local_1e0;
  ByteData256 local_1d8;
  ByteData256 local_1c0;
  undefined1 local_1a8 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  undefined1 local_178 [7];
  uint8_t leaf_version;
  undefined1 local_158 [8];
  Script script;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_80 [7];
  bool is_parity;
  Pubkey pubkey;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootScriptTree_Branch_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_80,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_80,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_d0,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x6d96a4,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string
              ((string *)
               &script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_178);
  this_01 = cfd::core::ScriptBuilder::operator<<
                      ((ScriptBuilder *)local_178,
                       (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_158,this_01);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_178);
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0xc4;
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_201);
  cfd::core::ByteData256::ByteData256(&local_1d8,&local_200);
  local_1e0 = &local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
             ,(allocator *)
              ((long)&tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_1c0,&local_228);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1a8._0_8_ = &local_1d8;
  local_1a8._8_8_ = (pointer)0x2;
  this_00 = (allocator<cfd::core::ByteData256> *)
            ((long)&tree.nodes_.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(this_00);
  __l._M_len = local_1a8._8_8_;
  __l._M_array = (iterator)local_1a8._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1a8 + 0x10),__l,this_00);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_ae0 = (ByteData256 *)local_1a8;
  do {
    local_ae0 = local_ae0 + -1;
    cfd::core::ByteData256::~ByteData256(local_ae0);
  } while (local_ae0 != &local_1d8);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_2c0,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,(Script *)local_158);
  pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1a8 + 0x10),0);
  cfd::core::TapBranch::TapBranch(&local_338,pvVar4);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_2c0,&local_338);
  cfd::core::TapBranch::~TapBranch(&local_338);
  pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1a8 + 0x10),1);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&gtest_ar_1.message_,pvVar4);
  cfd::core::TapBranch::AddBranch((TapBranch *)local_2c0,(SchnorrPubkey *)&gtest_ar_1.message_);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar_1.message_);
  local_361 = cfd::core::TapBranch::GetLeafVersion((TapBranch *)local_2c0);
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_360,"leaf_version","tree.GetLeafVersion()",
             (uchar *)((long)&nodes.
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_361);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar2) {
    testing::Message::Message(&local_370);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  cfd::core::Script::GetHex_abi_cxx11_(&local_3a8,(Script *)local_158);
  cfd::core::TapBranch::GetScript(&local_400,(TapBranch *)local_2c0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_3c8,&local_400);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_388,"script.GetHex()","tree.GetScript().GetHex()",&local_3a8,
             &local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  cfd::core::Script::~Script(&local_400);
  std::__cxx11::string::~string((string *)&local_3a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_428 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         (local_1a8 + 0x10));
  cfd::core::TaprootScriptTree::GetNodeList(&local_448,(TaprootScriptTree *)local_2c0);
  local_430 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        (&local_448);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_420,"nodes.size()","tree.GetNodeList().size()",&local_428,
             &local_430);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_448);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_450);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  sVar5 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     (local_1a8 + 0x10));
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&index,
             (TaprootScriptTree *)local_2c0);
  sVar6 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     &index);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&index);
  if (sVar5 == sVar6) {
    for (gtest_ar_4.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar1.ptr_ = gtest_ar_4.message_.ptr_,
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                           ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             *)(local_1a8 + 0x10)), sVar1.ptr_ < pbVar7;
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_4.message_.ptr_)->field_0x1) {
      pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *
                          )(local_1a8 + 0x10),(size_type)gtest_ar_4.message_.ptr_);
      cfd::core::ByteData256::GetHex_abi_cxx11_(&local_4a8,pvVar4);
      cfd::core::TaprootScriptTree::GetNodeList(&local_4e0,(TaprootScriptTree *)local_2c0);
      pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[](&local_4e0,(size_type)gtest_ar_4.message_.ptr_);
      cfd::core::ByteData256::GetHex_abi_cxx11_(&local_4c8,pvVar4);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_488,"nodes[index].GetHex()",
                 "tree.GetNodeList()[index].GetHex()",&local_4a8,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_4e0);
      std::__cxx11::string::~string((string *)&local_4a8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
      if (!bVar2) {
        testing::Message::Message(&local_4e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0x6a,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_4e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
    }
  }
  cfd::core::TaprootScriptTree::GetTapLeafHash(&local_538,(TaprootScriptTree *)local_2c0);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_520,&local_538);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_500,
             "\"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae\"",
             "tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
             &local_520);
  std::__cxx11::string::~string((string *)&local_520);
  cfd::core::ByteData256::~ByteData256(&local_538);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar2) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_590,(TapBranch *)local_2c0);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_578,&local_590);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_558,
             "\"daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4\"",
             "tree.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4",
             &local_578);
  std::__cxx11::string::~string((string *)&local_578);
  cfd::core::ByteData256::~ByteData256(&local_590);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  cfd::core::TapBranch::GetTweakedPubkey
            (&local_5e8,(TapBranch *)local_2c0,(SchnorrPubkey *)&gtest_ar.message_,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_5d0,&local_5e8);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_5b0,
             "\"cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a\"",
             "tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",
             (char (*) [65])"cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a",
             &local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_5e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar2) {
    testing::Message::Message(&local_5f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  cfd::core::TapBranch::GetTweakedPrivkey
            (&local_648,(TapBranch *)local_2c0,(Privkey *)local_30,(bool *)0x0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_628,&local_648);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_608,
             "\"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab\"",
             "tree.GetTweakedPrivkey(key).GetHex()",
             (char (*) [65])"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
             &local_628);
  std::__cxx11::string::~string((string *)&local_628);
  cfd::core::Privkey::~Privkey(&local_648);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar2) {
    testing::Message::Message(&local_650);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_608);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tree2.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tree2.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_650);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tree2.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_9.message_,(TaprootScriptTree *)local_2c0);
  cfd::core::TapBranch::GetTweakedPrivkey
            (&local_738,(TapBranch *)&gtest_ar_9.message_,(Privkey *)local_30,(bool *)0x0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_718,&local_738);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_6f8,
             "\"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab\"",
             "tree2.GetTweakedPrivkey(key).GetHex()",
             (char (*) [65])"9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
             &local_718);
  std::__cxx11::string::~string((string *)&local_718);
  cfd::core::Privkey::~Privkey(&local_738);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar2) {
    testing::Message::Message(&local_740);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_740);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_780,"e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02"
             ,(allocator *)
              ((long)&pk.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_760,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&sk.is_compressed_,(TapBranch *)local_2c0,
             (SchnorrPubkey *)&gtest_ar.message_,(bool *)0x0);
  cfd::core::TapBranch::GetTweakedPrivkey
            ((Privkey *)&sig.sighash_type_.is_anyone_can_pay_,(TapBranch *)local_2c0,
             (Privkey *)local_30,(bool *)0x0);
  cfd::core::SchnorrUtil::Sign
            ((SchnorrSignature *)&gtest_ar__1.message_,(ByteData256 *)local_760,
             (Privkey *)&sig.sighash_type_.is_anyone_can_pay_);
  local_7f9 = cfd::core::SchnorrPubkey::Verify
                        ((SchnorrPubkey *)&sk.is_compressed_,
                         (SchnorrSignature *)&gtest_ar__1.message_,(ByteData256 *)local_760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7f8,&local_7f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar2) {
    testing::Message::Message(&local_808);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&tree_str.field_2 + 8),(internal *)local_7f8,
               (AssertionResult *)"pk.Verify(sig, msg)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x7e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_810,&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    std::__cxx11::string::~string((string *)(tree_str.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  cfd::core::TapBranch::ToString_abi_cxx11_
            ((string *)((long)&exp_tree_str.field_2 + 8),(TapBranch *)local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_870,
             "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(51,c4)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}"
             ,(allocator *)((long)&gtest_ar_10.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_10.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_888,"exp_tree_str","tree_str",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_870,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&exp_tree_str.field_2 + 8));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar2) {
    testing::Message::Message(&local_890);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &br.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &br.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_890);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &br.branch_list_.
                super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  cfd::core::TapBranch::FromString((TapBranch *)&gtest_ar_11.message_,(string *)local_870);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_940,(TapBranch *)&gtest_ar_11.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_920,"exp_tree_str","br.ToString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_870,
             &local_940);
  std::__cxx11::string::~string((string *)&local_940);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar2) {
    testing::Message::Message(&local_948);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  cfd::core::TapBranch::~TapBranch((TapBranch *)&gtest_ar_11.message_);
  gtest_ar_13.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  cfd::core::TaprootScriptTree::FromString
            ((TaprootScriptTree *)local_a08,(string *)local_870,(Script *)local_158,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_a58,(TapBranch *)local_a08);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_a38,"exp_tree_str","rebuild_tree.ToString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_870,
             &local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar2) {
    testing::Message::Message(&local_a60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_1,&local_a60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_1);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_a08);
  std::__cxx11::string::~string((string *)local_870);
  std::__cxx11::string::~string((string *)(exp_tree_str.field_2._M_local_buf + 8));
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar__1.message_);
  cfd::core::Privkey::~Privkey((Privkey *)&sig.sighash_type_.is_anyone_can_pay_);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&sk.is_compressed_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_760);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_2c0);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1a8 + 0x10));
  cfd::core::Script::~Script((Script *)local_158);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, Branch) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script script = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  uint8_t leaf_version = 0xc4;
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(leaf_version, script);
  tree.AddBranch(TapBranch(nodes[0]));
  tree.AddBranch(SchnorrPubkey(nodes[1]));

  EXPECT_EQ(leaf_version, tree.GetLeafVersion());
  EXPECT_EQ(script.GetHex(), tree.GetScript().GetHex());
  EXPECT_EQ(nodes.size(), tree.GetNodeList().size());
  if (nodes.size() == tree.GetNodeList().size()) {
    for (size_t index=0; index<nodes.size(); ++index) {
      EXPECT_EQ(nodes[index].GetHex(), tree.GetNodeList()[index].GetHex());
    }
  }
  EXPECT_EQ("b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
      tree.GetTweakedPrivkey(key).GetHex());

  TaprootScriptTree tree2(tree);
  EXPECT_EQ("9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
      tree2.GetTweakedPrivkey(key).GetHex());

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));

  auto tree_str = tree.ToString();
  std::string exp_tree_str = "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(51,c4)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}";
  EXPECT_EQ(exp_tree_str, tree_str);

  try {
    auto br = TapBranch::FromString(exp_tree_str);
    EXPECT_EQ(exp_tree_str, br.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    auto rebuild_tree = TaprootScriptTree::FromString(exp_tree_str, script);
    EXPECT_EQ(exp_tree_str, rebuild_tree.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}